

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O0

void __thiscall check_construction_of_heat_maps::test_method(check_construction_of_heat_maps *this)

{
  pointer *__return_storage_ptr__;
  undefined8 uVar1;
  bool bVar2;
  uint dimension;
  lazy_ostream *prev;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1d8;
  assertion_result local_1b8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  undefined1 local_180 [8];
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> q;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  undefined1 local_c0 [8];
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  check_construction_of_heat_maps *this_local;
  
  __return_storage_ptr__ =
       &p.heat_map.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Gudhi::Persistence_representations::create_Gaussian_filter
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)__return_storage_ptr__,100,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_d8,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__);
  dimension = std::numeric_limits<unsigned_int>::max();
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0,"data/file_with_diagram",&local_d8,false,1000,0.0,1.0,dimension);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_d8);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  print_to_file((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                 *)local_c0,"data/persistence_heat_map_from_file_with_diagram");
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_180);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                  *)local_180,"data/persistence_heat_map_from_file_with_diagram");
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
               ,0x89);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_190,0x21,&local_1a0);
    bVar2 = Gudhi::Persistence_representations::
            Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
            operator==((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                        *)local_c0,
                       (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                        *)local_180);
    boost::test_tools::assertion_result::assertion_result(&local_1b8,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_1e8,"p == q",6)
    ;
    boost::unit_test::operator<<(&local_1d8,prev,&local_1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
               ,0x89);
    boost::test_tools::tt_detail::report_assertion(&local_1b8,&local_1d8,&local_1f8,0x21,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1d8);
    boost::test_tools::assertion_result::~assertion_result(&local_1b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_180);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&p.heat_map.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(100, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 1000, 0, 1);
  p.print_to_file("data/persistence_heat_map_from_file_with_diagram");

  Persistence_heat_maps<constant_scaling_function> q;
  q.load_from_file("data/persistence_heat_map_from_file_with_diagram");

  BOOST_CHECK(p == q);
}